

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHKeyConsistency_Test::TestBody(SSLTest_ECHKeyConsistency_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *pEVar2;
  char *in_R9;
  AssertHelper local_340;
  AssertionResult gtest_ar__9;
  AssertHelper local_328;
  AssertionResult gtest_ar__7;
  UniquePtr<SSL_ECH_KEYS> keys;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ech_config;
  size_t public_key_len;
  ECHConfigParams wrong_kem;
  ECHConfigParams truncated;
  ScopedEVP_HPKE_KEY wrong_key;
  ECHConfigParams params;
  ScopedEVP_HPKE_KEY key;
  uint8_t public_key [65];
  
  keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)SSL_ECH_KEYS_new();
  truncated.public_name._M_dataplus._M_p = (pointer)0x0;
  truncated.version._0_1_ =
       (tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
       keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0;
  if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
      keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&wrong_kem);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&params,(internal *)&truncated,(AssertionResult *)0x2f7801,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x7ce,(char *)params._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key,(Message *)&wrong_kem);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key);
    std::__cxx11::string::~string((string *)&params);
    if ((long *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&truncated.public_name);
    goto LAB_0015b4e0;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&truncated.public_name);
  EVP_HPKE_KEY_zero(&key.ctx_);
  pEVar2 = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_generate(&key.ctx_,pEVar2);
  truncated.public_name._M_dataplus._M_p = (pointer)0x0;
  truncated.version._0_1_ = iVar1 != 0;
  if (iVar1 == 0) {
    testing::Message::Message((Message *)&wrong_kem);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&params,(internal *)&truncated,
               (AssertionResult *)"EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&wrong_key,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,2000,(char *)params._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&wrong_key,(Message *)&wrong_kem);
LAB_0015b21b:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&wrong_key);
    std::__cxx11::string::~string((string *)&params);
    if ((long *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&truncated.public_name);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&truncated.public_name);
    iVar1 = EVP_HPKE_KEY_public_key(&key.ctx_,public_key,&public_key_len,0x41);
    truncated.public_name._M_dataplus._M_p = (pointer)0x0;
    truncated.version._0_1_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&wrong_kem);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&params,(internal *)&truncated,
                 (AssertionResult *)
                 "EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len, sizeof(public_key))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&wrong_key,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7d4,(char *)params._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&wrong_key,(Message *)&wrong_kem);
      goto LAB_0015b21b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&truncated.public_name);
    ECHConfigParams::ECHConfigParams(&params);
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    params.key = &key.ctx_;
    wrong_kem.version._0_1_ = MakeECHConfig(&ech_config,&params);
    wrong_kem.public_name._M_dataplus._M_p = (pointer)0x0;
    if ((bool)(undefined1)wrong_kem.version) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&wrong_kem.public_name);
      iVar1 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                               keys._M_t.
                               super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                               ech_config.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)ech_config.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)ech_config.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
      wrong_kem.public_name._M_dataplus._M_p = (pointer)0x0;
      wrong_kem.version._0_1_ = iVar1 != 0;
      if (!(bool)(undefined1)wrong_kem.version) {
        testing::Message::Message((Message *)&wrong_key);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&truncated,(internal *)&wrong_kem,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7dd,(char *)CONCAT71(truncated._1_7_,(undefined1)truncated.version));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__7,(Message *)&wrong_key);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
        std::__cxx11::string::~string((string *)&truncated);
        if (wrong_key.ctx_.kem != (EVP_HPKE_KEM *)0x0) {
          (**(code **)(*(long *)wrong_key.ctx_.kem + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&wrong_kem.public_name);
      EVP_HPKE_KEY_zero(&wrong_key.ctx_);
      pEVar2 = EVP_hpke_x25519_hkdf_sha256();
      iVar1 = EVP_HPKE_KEY_generate(&wrong_key.ctx_,pEVar2);
      wrong_kem.public_name._M_dataplus._M_p = (pointer)0x0;
      wrong_kem.version._0_1_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&gtest_ar__7);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&truncated,(internal *)&wrong_kem,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__9,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7e2,(char *)CONCAT71(truncated._1_7_,(undefined1)truncated.version));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar__9,(Message *)&gtest_ar__7);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9);
        std::__cxx11::string::~string((string *)&truncated);
        if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&wrong_kem.public_name);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&wrong_kem.public_name);
        iVar1 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                 keys._M_t.
                                 super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                 ech_config.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)ech_config.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)ech_config.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,&wrong_key.ctx_);
        wrong_kem.public_name._M_dataplus._M_p = (pointer)0x0;
        wrong_kem.version._0_1_ = iVar1 == 0;
        if (!(bool)(undefined1)wrong_kem.version) {
          testing::Message::Message((Message *)&gtest_ar__7);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&truncated,(internal *)&wrong_kem,
                     (AssertionResult *)
                     "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), wrong_key.get())"
                     ,"true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__9,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7e5,(char *)CONCAT71(truncated._1_7_,(undefined1)truncated.version));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__9,(Message *)&gtest_ar__7);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9);
          std::__cxx11::string::~string((string *)&truncated);
          if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&wrong_kem.public_name);
        ECHConfigParams::ECHConfigParams(&truncated);
        truncated.key = &key.ctx_;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&truncated.public_key,
                   public_key,key.ctx_.public_key + public_key_len + 0x47);
        gtest_ar__7.success_ = MakeECHConfig(&ech_config,&truncated);
        gtest_ar__7.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (gtest_ar__7.success_) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__7.message_);
          iVar1 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                   keys._M_t.
                                   super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                                   ech_config.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (long)ech_config.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ech_config.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
          gtest_ar__7.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__7.success_ = iVar1 == 0;
          if (!gtest_ar__7.success_) {
            testing::Message::Message((Message *)&gtest_ar__9);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&wrong_kem,(internal *)&gtest_ar__7,
                       (AssertionResult *)
                       "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                       ,"true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_340,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7ee,(char *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version));
            testing::internal::AssertHelper::operator=(&local_340,(Message *)&gtest_ar__9);
            testing::internal::AssertHelper::~AssertHelper(&local_340);
            std::__cxx11::string::~string((string *)&wrong_kem);
            if ((long *)CONCAT71(gtest_ar__9._1_7_,gtest_ar__9.success_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(gtest_ar__9._1_7_,gtest_ar__9.success_) + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__7.message_);
          ECHConfigParams::ECHConfigParams(&wrong_kem);
          wrong_kem.kem_id = 0x10;
          wrong_kem.key = &key.ctx_;
          gtest_ar__9.success_ = MakeECHConfig(&ech_config,&wrong_kem);
          gtest_ar__9.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          if (gtest_ar__9.success_) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__9.message_);
            iVar1 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                                     keys._M_t.
                                     super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1
                                     ,ech_config.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                     (long)ech_config.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ech_config.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,&key.ctx_);
            gtest_ar__9.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar__9.success_ = iVar1 == 0;
            if (!gtest_ar__9.success_) {
              testing::Message::Message((Message *)&local_340);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                         (AssertionResult *)
                         "SSL_ECH_KEYS_add(keys.get(), 1, ech_config.data(), ech_config.size(), key.get())"
                         ,"true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_328,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x7f8,(char *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_));
              testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_340);
              goto LAB_0015b46c;
            }
          }
          else {
            testing::Message::Message((Message *)&local_340);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__7,(internal *)&gtest_ar__9,
                       (AssertionResult *)"MakeECHConfig(&ech_config, wrong_kem)","false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_328,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x7f5,(char *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_));
            testing::internal::AssertHelper::operator=(&local_328,(Message *)&local_340);
LAB_0015b46c:
            testing::internal::AssertHelper::~AssertHelper(&local_328);
            std::__cxx11::string::~string((string *)&gtest_ar__7);
            if (local_340.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_340.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__9.message_);
          ECHConfigParams::~ECHConfigParams(&wrong_kem);
        }
        else {
          testing::Message::Message((Message *)&gtest_ar__9);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&wrong_kem,(internal *)&gtest_ar__7,
                     (AssertionResult *)"MakeECHConfig(&ech_config, truncated)","false","true",in_R9
                    );
          testing::internal::AssertHelper::AssertHelper
                    (&local_340,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x7eb,(char *)CONCAT71(wrong_kem._1_7_,(undefined1)wrong_kem.version));
          testing::internal::AssertHelper::operator=(&local_340,(Message *)&gtest_ar__9);
          testing::internal::AssertHelper::~AssertHelper(&local_340);
          std::__cxx11::string::~string((string *)&wrong_kem);
          if ((long *)CONCAT71(gtest_ar__9._1_7_,gtest_ar__9.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar__9._1_7_,gtest_ar__9.success_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__7.message_);
        }
        ECHConfigParams::~ECHConfigParams(&truncated);
      }
      internal::
      StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
      ::~StackAllocatedMovable(&wrong_key);
    }
    else {
      testing::Message::Message((Message *)&wrong_key);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&truncated,(internal *)&wrong_kem,
                 (AssertionResult *)"MakeECHConfig(&ech_config, params)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__7,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7da,(char *)CONCAT71(truncated._1_7_,(undefined1)truncated.version));
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&wrong_key)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
      std::__cxx11::string::~string((string *)&truncated);
      if (wrong_key.ctx_.kem != (EVP_HPKE_KEM *)0x0) {
        (**(code **)(*(long *)wrong_key.ctx_.kem + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&wrong_kem.public_name);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&ech_config.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ECHConfigParams::~ECHConfigParams(&params);
  }
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
LAB_0015b4e0:
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
  return;
}

Assistant:

TEST(SSLTest, ECHKeyConsistency) {
  bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
  ASSERT_TRUE(keys);
  bssl::ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
  uint8_t public_key[EVP_HPKE_MAX_PUBLIC_KEY_LENGTH];
  size_t public_key_len;
  ASSERT_TRUE(EVP_HPKE_KEY_public_key(key.get(), public_key, &public_key_len,
                                      sizeof(public_key)));

  // Adding an ECHConfig with the matching public key succeeds.
  ECHConfigParams params;
  params.key = key.get();
  std::vector<uint8_t> ech_config;
  ASSERT_TRUE(MakeECHConfig(&ech_config, params));
  EXPECT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                               ech_config.data(), ech_config.size(),
                               key.get()));

  // Adding an ECHConfig with the wrong public key is an error.
  bssl::ScopedEVP_HPKE_KEY wrong_key;
  ASSERT_TRUE(
      EVP_HPKE_KEY_generate(wrong_key.get(), EVP_hpke_x25519_hkdf_sha256()));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                wrong_key.get()));

  // Adding an ECHConfig with a truncated public key is an error.
  ECHConfigParams truncated;
  truncated.key = key.get();
  truncated.public_key.assign(public_key, public_key + public_key_len - 1);
  ASSERT_TRUE(MakeECHConfig(&ech_config, truncated));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));

  // Adding an ECHConfig with the right public key, but wrong KEM ID, is an
  // error.
  ECHConfigParams wrong_kem;
  wrong_kem.key = key.get();
  wrong_kem.kem_id = 0x0010;  // DHKEM(P-256, HKDF-SHA256)
  ASSERT_TRUE(MakeECHConfig(&ech_config, wrong_kem));
  EXPECT_FALSE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                ech_config.data(), ech_config.size(),
                                key.get()));
}